

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void testJsonParseError(void)

{
  JsonParser numberParser;
  JsonParser trueParser;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  JsonParser local_168;
  JsonParser local_100;
  JsonValue local_98;
  JsonValue local_58;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188," true xx",(allocator<char> *)&local_168);
  crawler::JsonParser::JsonParser(&local_100,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8," 0 12",&local_1a9);
  crawler::JsonParser::JsonParser(&local_168,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  crawler::JsonParser::parse(&local_58,&local_100);
  std::__detail::__variant::
  _Variant_storage<false,_double,_bool,_std::nullptr_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<crawler::JsonValue,_std::allocator<crawler::JsonValue>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_crawler::JsonValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_crawler::JsonValue>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_double,_bool,_std::nullptr_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<crawler::JsonValue,_std::allocator<crawler::JsonValue>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_crawler::JsonValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_crawler::JsonValue>_>_>_>
                       *)&local_58);
  test_count = test_count + 1;
  fprintf(_stderr,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
          "testJsonParseError",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp",
          0x197,"true == (0)",1,0);
  crawler::JsonParser::parse(&local_98,&local_168);
  std::__detail::__variant::
  _Variant_storage<false,_double,_bool,_std::nullptr_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<crawler::JsonValue,_std::allocator<crawler::JsonValue>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_crawler::JsonValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_crawler::JsonValue>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_double,_bool,_std::nullptr_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<crawler::JsonValue,_std::allocator<crawler::JsonValue>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_crawler::JsonValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_crawler::JsonValue>_>_>_>
                       *)&local_98);
  test_count = test_count + 1;
  fprintf(_stderr,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
          "testJsonParseError",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp",
          0x19d,"true == (0)",1,0);
  crawler::JsonParser::~JsonParser(&local_168);
  crawler::JsonParser::~JsonParser(&local_100);
  return;
}

Assistant:

void testJsonParseError() {
  crawler::JsonParser trueParser(" true xx");
  crawler::JsonParser numberParser(" 0 12");
  try {
    trueParser.parse();

    // it should be unreachable, otherwise, it should failed.
    ASSERT_TRUE(0);
  } catch (const std::runtime_error &error) {
    ASSERT_CSTRING_EQ("PARSE_ROOT_NOT_SINGULAR", error.what());
  }
  try {
    numberParser.parse();
    ASSERT_TRUE(0);
  } catch (const std::runtime_error &error) {
    ASSERT_CSTRING_EQ("PARSE_ROOT_NOT_SINGULAR", error.what());
  }
}